

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_option_u.c
# Opt level: O0

void test_option_u(void)

{
  wchar_t wVar1;
  int iVar2;
  size_t sStack_28;
  int r;
  size_t s;
  char *p;
  utimbuf times;
  
  assertion_make_file("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/cpio/test/test_option_u.c"
                      ,L'\x16',"f",L'Ƥ',L'\xffffffff',"a");
  wVar1 = systemf("echo f| %s -pd copy >copy.out 2>copy.err",testprog);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/cpio/test/test_option_u.c"
                      ,L'\x1b',(long)wVar1,"r",0,"0",(void *)0x0);
  s = (size_t)slurpfile(&stack0xffffffffffffffd8,"copy/f");
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/cpio/test/test_option_u.c"
                      ,L'\x1f',sStack_28,"s",1,"1",(void *)0x0);
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/cpio/test/test_option_u.c"
                      ,L' ',(void *)s,"p","a","\"a\"",1,"1",(void *)0x0);
  free((void *)s);
  assertion_make_file("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/cpio/test/test_option_u.c"
                      ,L'$',"f",L'Ƥ',L'\xffffffff',"b");
  memset(&p,0,0x10);
  p = (char *)0x1;
  times.actime = 3;
  iVar2 = utime("f",(utimbuf *)&p);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/cpio/test/test_option_u.c"
                      ,L'*',0,"0",(long)iVar2,"utime(\"f\", &times)",(void *)0x0);
  wVar1 = systemf("echo f| %s -pd copy >copy.out 2>copy.err",testprog);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/cpio/test/test_option_u.c"
                      ,L'/',(long)wVar1,"r",0,"0",(void *)0x0);
  s = (size_t)slurpfile(&stack0xffffffffffffffd8,"copy/f");
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/cpio/test/test_option_u.c"
                      ,L'3',sStack_28,"s",1,"1",(void *)0x0);
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/cpio/test/test_option_u.c"
                      ,L'4',(void *)s,"p","a","\"a\"",1,"1",(void *)0x0);
  free((void *)s);
  wVar1 = systemf("echo f| %s -pud copy >copy.out 2>copy.err",testprog);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/cpio/test/test_option_u.c"
                      ,L':',(long)wVar1,"r",0,"0",(void *)0x0);
  s = (size_t)slurpfile(&stack0xffffffffffffffd8,"copy/f");
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/cpio/test/test_option_u.c"
                      ,L'>',sStack_28,"s",1,"1",(void *)0x0);
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/cpio/test/test_option_u.c"
                      ,L'?',(void *)s,"p","b","\"b\"",1,"1",(void *)0x0);
  free((void *)s);
  return;
}

Assistant:

DEFINE_TEST(test_option_u)
{
	struct utimbuf times;
	char *p;
	size_t s;
	int r;

	/* Create a file. */
	assertMakeFile("f", 0644, "a");

	/* Copy the file to the "copy" dir. */
	r = systemf("echo f| %s -pd copy >copy.out 2>copy.err",
	    testprog);
	assertEqualInt(r, 0);

	/* Check that the file contains only a single "a" */
	p = slurpfile(&s, "copy/f");
	assertEqualInt(s, 1);
	assertEqualMem(p, "a", 1);
	free(p);

	/* Recreate the file with a single "b" */
	assertMakeFile("f", 0644, "b");

	/* Set the mtime to the distant past. */
	memset(&times, 0, sizeof(times));
	times.actime = 1;
	times.modtime = 3;
	assertEqualInt(0, utime("f", &times));

	/* Copy the file to the "copy" dir. */
	r = systemf("echo f| %s -pd copy >copy.out 2>copy.err",
	    testprog);
	assertEqualInt(r, 0);

	/* Verify that the file hasn't changed (it wasn't overwritten) */
	p = slurpfile(&s, "copy/f");
	assertEqualInt(s, 1);
	assertEqualMem(p, "a", 1);
	free(p);

	/* Copy the file to the "copy" dir with -u (force) */
	r = systemf("echo f| %s -pud copy >copy.out 2>copy.err",
	    testprog);
	assertEqualInt(r, 0);

	/* Verify that the file has changed (it was overwritten) */
	p = slurpfile(&s, "copy/f");
	assertEqualInt(s, 1);
	assertEqualMem(p, "b", 1);
	free(p);
}